

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membervariable.cpp
# Opt level: O3

void __thiscall
cppgenerate::MemberVariable::print
          (MemberVariable *this,ostream *stream,int indent,bool withAccessModifier)

{
  string *__rhs;
  AccessModifier AVar1;
  pointer pcVar2;
  CodeBlock *pCVar3;
  long *plVar4;
  undefined8 *puVar5;
  long *plVar6;
  size_type *psVar7;
  _Alloc_hider _Var8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  CodeBlock block;
  long *local_398;
  long local_390;
  long local_388;
  long lStack_380;
  long *local_378;
  long local_370;
  long local_368;
  long lStack_360;
  ostream *local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [384];
  
  CodeBlock::CodeBlock((CodeBlock *)local_1b0);
  if (((this->super_Variable).m_name._M_string_length == 0) ||
     ((this->super_Variable).m_type._M_string_length == 0)) goto LAB_00111ae5;
  if (withAccessModifier) {
    AVar1 = this->m_access;
    if (AVar1 == PROTECTED) {
      paVar9 = &local_210.field_2;
      local_210._M_dataplus._M_p = (pointer)paVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"protected:","");
      CodeBlock::addLine((CodeBlock *)local_1b0,&local_210);
      _Var8._M_p = local_210._M_dataplus._M_p;
    }
    else if (AVar1 == PRIVATE) {
      paVar9 = &local_1f0.field_2;
      local_1f0._M_dataplus._M_p = (pointer)paVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"private:","");
      CodeBlock::addLine((CodeBlock *)local_1b0,&local_1f0);
      _Var8._M_p = local_1f0._M_dataplus._M_p;
    }
    else {
      if (AVar1 != PUBLIC) goto LAB_0011147c;
      paVar9 = &local_1d0.field_2;
      local_1d0._M_dataplus._M_p = (pointer)paVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"public:","");
      CodeBlock::addLine((CodeBlock *)local_1b0,&local_1d0);
      _Var8._M_p = local_1d0._M_dataplus._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var8._M_p != paVar9) {
      operator_delete(_Var8._M_p);
    }
  }
LAB_0011147c:
  pCVar3 = CodeBlock::indent((CodeBlock *)local_1b0);
  pcVar2 = (this->super_Variable).m_type._M_dataplus._M_p;
  local_378 = &local_368;
  local_358 = stream;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_378,pcVar2,pcVar2 + (this->super_Variable).m_type._M_string_length);
  std::__cxx11::string::append((char *)&local_378);
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_378,
                              (ulong)(this->super_Variable).m_name._M_dataplus._M_p);
  local_398 = &local_388;
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_388 = *plVar6;
    lStack_380 = plVar4[3];
  }
  else {
    local_388 = *plVar6;
    local_398 = (long *)*plVar4;
  }
  local_390 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_398);
  psVar7 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_290.field_2._M_allocated_capacity = *psVar7;
    local_290.field_2._8_8_ = plVar4[3];
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  }
  else {
    local_290.field_2._M_allocated_capacity = *psVar7;
    local_290._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_290._M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  pCVar3 = CodeBlock::addLine(pCVar3,&local_290);
  CodeBlock::unindent(pCVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  if (local_398 != &local_388) {
    operator_delete(local_398);
  }
  if (local_378 != &local_368) {
    operator_delete(local_378);
  }
  __rhs = &(this->super_Variable).m_name;
  if (this->m_generateSetter == true) {
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"public:","");
    pCVar3 = CodeBlock::addLine((CodeBlock *)local_1b0,&local_2f0);
    std::operator+(&local_350,"void set",__rhs);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_350);
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_368 = *plVar6;
      lStack_360 = plVar4[3];
      local_378 = &local_368;
    }
    else {
      local_368 = *plVar6;
      local_378 = (long *)*plVar4;
    }
    local_370 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_378,(ulong)(this->super_Variable).m_type._M_dataplus._M_p);
    local_398 = &local_388;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_388 = *plVar4;
      lStack_380 = puVar5[3];
    }
    else {
      local_388 = *plVar4;
      local_398 = (long *)*puVar5;
    }
    local_390 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_398);
    local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
    psVar7 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_330.field_2._M_allocated_capacity = *psVar7;
      local_330.field_2._8_8_ = plVar4[3];
    }
    else {
      local_330.field_2._M_allocated_capacity = *psVar7;
      local_330._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_330._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    pCVar3 = CodeBlock::addLine(pCVar3,&local_330);
    pCVar3 = CodeBlock::indent(pCVar3);
    pcVar2 = (this->super_Variable).m_name._M_dataplus._M_p;
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_310,pcVar2,pcVar2 + (this->super_Variable).m_name._M_string_length);
    std::__cxx11::string::append((char *)&local_310);
    pCVar3 = CodeBlock::addLine(pCVar3,&local_310);
    pCVar3 = CodeBlock::unindent(pCVar3);
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"}","");
    CodeBlock::addLine(pCVar3,&local_230);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p);
    }
    if (local_398 != &local_388) {
      operator_delete(local_398);
    }
    if (local_378 != &local_368) {
      operator_delete(local_378);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p);
    }
  }
  if (this->m_generateGetter == true) {
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"public:","");
    pCVar3 = CodeBlock::addLine((CodeBlock *)local_1b0,&local_250);
    pcVar2 = (this->super_Variable).m_type._M_dataplus._M_p;
    local_378 = &local_368;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_378,pcVar2,pcVar2 + (this->super_Variable).m_type._M_string_length);
    std::__cxx11::string::append((char *)&local_378);
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_378,(ulong)(this->super_Variable).m_name._M_dataplus._M_p);
    local_398 = &local_388;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_388 = *plVar4;
      lStack_380 = puVar5[3];
    }
    else {
      local_388 = *plVar4;
      local_398 = (long *)*puVar5;
    }
    local_390 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_398);
    psVar7 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_2b0.field_2._M_allocated_capacity = *psVar7;
      local_2b0.field_2._8_8_ = plVar4[3];
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    }
    else {
      local_2b0.field_2._M_allocated_capacity = *psVar7;
      local_2b0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_2b0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    pCVar3 = CodeBlock::addLine(pCVar3,&local_2b0);
    pCVar3 = CodeBlock::indent(pCVar3);
    std::operator+(&local_350,"return ",__rhs);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_350);
    psVar7 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_2d0.field_2._M_allocated_capacity = *psVar7;
      local_2d0.field_2._8_8_ = plVar4[3];
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar7;
      local_2d0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_2d0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    pCVar3 = CodeBlock::addLine(pCVar3,&local_2d0);
    pCVar3 = CodeBlock::unindent(pCVar3);
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"}","");
    CodeBlock::addLine(pCVar3,&local_270);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p);
    }
    if (local_398 != &local_388) {
      operator_delete(local_398);
    }
    if (local_378 != &local_368) {
      operator_delete(local_378);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p);
    }
  }
  CodeBlock::print((CodeBlock *)local_1b0,local_358);
LAB_00111ae5:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x70));
  return;
}

Assistant:

void MemberVariable::print( std::ostream& stream, int indent, bool withAccessModifier ) const {
    cppgenerate::CodeBlock block;

    if( m_name.size() == 0 || m_type.size() == 0 ){
        //Can't generate code for this memvar
        return;
    }

    if( withAccessModifier ){
        switch( m_access ){
            case AccessModifier::PUBLIC:
                block.addLine( "public:");
                break;
            case AccessModifier::PRIVATE:
                block.addLine( "private:");
                break;
            case AccessModifier::PROTECTED:
                block.addLine( "protected:");
                break;
        }
    }

    block.indent()
        .addLine( m_type + " " + m_name + ";" )
        .unindent();

    if( m_generateSetter ){
        block.addLine( "public:" )
            .addLine( "void set" + m_name + "( " + m_type + " arg ){" )
            .indent()
            .addLine( m_name + " = arg;" )
            .unindent()
            .addLine( "}" );
    }

    if( m_generateGetter ){
        block.addLine( "public:" )
            .addLine( m_type + " get" + m_name + "(){" )
            .indent()
            .addLine( "return " + m_name + ";" )
            .unindent()
            .addLine( "}" );
    }

    block.print( stream );
}